

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnaryAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::optional<slang::ast::SequenceRange>&>
          (BumpAllocator *this,UnaryAssertionOperator *args,AssertionExpr *args_1,
          optional<slang::ast::SequenceRange> *args_2)

{
  optional<slang::ast::SequenceRange> range;
  UnaryAssertionExpr *pUVar1;
  UnaryAssertionExpr *in_RCX;
  BumpAllocator *in_RDX;
  undefined8 in_RSI;
  size_t in_stack_ffffffffffffffd8;
  
  pUVar1 = (UnaryAssertionExpr *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  range.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRange>._8_8_ = in_RSI;
  range.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_8_ = in_RDX;
  ast::UnaryAssertionExpr::UnaryAssertionExpr
            (in_RCX,(UnaryAssertionOperator)((ulong)(in_RCX->super_AssertionExpr).syntax >> 0x20),
             *(AssertionExpr **)&in_RCX->super_AssertionExpr,range);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }